

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslGrammar.cpp
# Opt level: O2

bool __thiscall
glslang::HlslGrammar::acceptDeclarationList(HlslGrammar *this,TIntermNode **nodeList)

{
  bool bVar1;
  
  do {
    do {
      bVar1 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokSemicolon);
    } while (bVar1);
    bVar1 = HlslTokenStream::peekTokenClass(&this->super_HlslTokenStream,EHTokNone);
    if (bVar1) {
      return true;
    }
    bVar1 = HlslTokenStream::peekTokenClass(&this->super_HlslTokenStream,EHTokRightBrace);
    if (bVar1) {
      return true;
    }
    bVar1 = acceptDeclaration(this,nodeList);
  } while (bVar1);
  expected(this,"declaration");
  return false;
}

Assistant:

bool HlslGrammar::acceptDeclarationList(TIntermNode*& nodeList)
{
    do {
        // HLSL allows extra semicolons between global declarations
        do { } while (acceptTokenClass(EHTokSemicolon));

        // EOF or RIGHT_BRACE
        if (peekTokenClass(EHTokNone) || peekTokenClass(EHTokRightBrace))
            return true;

        // declaration
        if (! acceptDeclaration(nodeList)) {
            expected("declaration");
            return false;
        }
    } while (true);

    return true;
}